

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall
fasttext::AutotuneStrategy::AutotuneStrategy
          (AutotuneStrategy *this,Args *originalArgs,result_type seed)

{
  initializer_list<int> __l;
  Args *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  Args *in_stack_ffffffffffffff98;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffffa0;
  AutotuneStrategy *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  uint in_stack_ffffffffffffffb8;
  
  this_01 = in_RDI;
  Args::Args(in_RSI);
  *(int *)&this_01[0x11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = in_RSI->autotuneDuration;
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine(in_stack_ffffffffffffffa0,(result_type)in_stack_ffffffffffffff98);
  *(undefined4 *)
   &in_RDI[0x11].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[0x11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)
   &in_RDI[0x12].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = 1;
  *(undefined4 *)
   ((long)&in_RDI[0x12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 2000000;
  *(int *)&in_RDI[0x12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish = in_RSI->bucket;
  this_00 = (AutotuneStrategy *)
            &in_RDI[0x12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19df82);
  __l._M_len._0_4_ = 2;
  __l._M_array = (iterator)(ulong)in_stack_ffffffffffffffb8;
  __l._M_len._4_4_ = 3;
  std::vector<int,_std::allocator<int>_>::operator=(this_01,__l);
  updateBest(this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

AutotuneStrategy::AutotuneStrategy(
    const Args& originalArgs,
    std::minstd_rand::result_type seed)
    : bestArgs_(),
      maxDuration_(originalArgs.autotuneDuration),
      rng_(seed),
      trials_(0),
      bestMinnIndex_(0),
      bestDsubExponent_(1),
      bestNonzeroBucket_(2000000),
      originalBucket_(originalArgs.bucket) {
  minnChoices_ = {0, 2, 3};
  updateBest(originalArgs);
}